

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::anon_unknown_15::XmlReporter::report_query(XmlReporter *this,QueryData *in)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ContextOptions *pCVar4;
  _Base_ptr p_Var5;
  char *attribute;
  TestCaseData *file;
  ulong uVar6;
  ScopedElement scoped_3;
  ScopedElement scoped;
  ScopedElement scoped_2;
  string local_108;
  string local_e8;
  XmlReporter *local_c8;
  undefined1 local_c0 [36];
  uint local_9c;
  undefined1 local_98 [32];
  ScopedElement local_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (*(this->super_IReporter)._vptr_IReporter[1])();
  pCVar4 = this->opt;
  local_c8 = this;
  if (pCVar4->list_reporters == true) {
    getListeners();
    if ((_Rb_tree_header *)getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &getListeners::data._M_t._M_impl.super__Rb_tree_header) {
      pXVar1 = &local_c8->xml;
      p_Var5 = getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Listener","");
        local_98._0_8_ = pXVar1;
        XmlWriter::startElement(pXVar1,&local_108);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"priority","");
        XmlWriter::writeAttribute<int>(pXVar1,&local_e8,(int *)(p_Var5 + 1));
        local_c0._0_8_ = (XmlWriter *)(local_c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"name","");
        XmlWriter::writeAttribute<doctest::String>
                  (pXVar1,(string *)local_c0,(String *)&p_Var5[1]._M_parent);
        if ((XmlWriter *)local_c0._0_8_ != (XmlWriter *)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &getListeners::data._M_t._M_impl.super__Rb_tree_header);
    }
    getReporters();
    if ((_Rb_tree_header *)getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &getReporters::data._M_t._M_impl.super__Rb_tree_header) {
      pXVar1 = &local_c8->xml;
      p_Var5 = getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Reporter","");
        local_98._0_8_ = pXVar1;
        XmlWriter::startElement(pXVar1,&local_108);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"priority","");
        XmlWriter::writeAttribute<int>(pXVar1,&local_e8,(int *)(p_Var5 + 1));
        local_c0._0_8_ = (XmlWriter *)(local_c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"name","");
        XmlWriter::writeAttribute<doctest::String>
                  (pXVar1,(string *)local_c0,(String *)&p_Var5[1]._M_parent);
        if ((XmlWriter *)local_c0._0_8_ != (XmlWriter *)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &getReporters::data._M_t._M_impl.super__Rb_tree_header);
    }
  }
  else {
    if ((pCVar4->count == false) && (pCVar4->list_test_cases != true)) {
      if (pCVar4->list_test_suites != true) goto LAB_0010e2c6;
      if (in->num_data != 0) {
        pXVar1 = &this->xml;
        uVar6 = 0;
        do {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"TestSuite","");
          local_c0._0_8_ = pXVar1;
          XmlWriter::startElement(pXVar1,&local_108);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"name","");
          XmlWriter::writeAttribute(pXVar1,&local_e8,in->data[uVar6]->m_test_suite);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < in->num_data);
      }
      paVar2 = &local_108.field_2;
      local_108._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"OverallResultsTestCases","");
      pXVar1 = &local_c8->xml;
      local_c0._0_8_ = pXVar1;
      XmlWriter::startElement(pXVar1,&local_108);
      paVar3 = &local_e8.field_2;
      local_e8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"unskipped","");
      XmlWriter::writeAttribute<unsigned_int>
                (pXVar1,&local_e8,&in->run_stats->numTestCasesPassingFilters);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar3) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      local_108._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"OverallResultsTestSuites","");
      local_c0._0_8_ = pXVar1;
      XmlWriter::startElement(pXVar1,&local_108);
      local_e8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"unskipped","");
      XmlWriter::writeAttribute<unsigned_int>
                (pXVar1,&local_e8,&in->run_stats->numTestSuitesPassingFilters);
    }
    else {
      if (in->num_data != 0) {
        pXVar1 = &this->xml;
        uVar6 = 0;
        do {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"TestCase","");
          local_78.m_writer = pXVar1;
          XmlWriter::startElement(pXVar1,&local_108);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"name","");
          XmlWriter::writeAttribute(pXVar1,&local_e8,in->data[uVar6]->m_name);
          local_c0._0_8_ = local_c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"testsuite","");
          XmlWriter::writeAttribute(pXVar1,(string *)local_c0,in->data[uVar6]->m_test_suite);
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"filename","");
          file = in->data[uVar6];
          if ((file->m_file).field_0.buf[0x17] < '\0') {
            file = (TestCaseData *)(file->m_file).field_0.data.ptr;
          }
          attribute = skipPathFromFilename((char *)file);
          XmlWriter::writeAttribute(pXVar1,(string *)local_98,attribute);
          local_50._M_allocated_capacity = (size_type)&local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"line","");
          local_9c = 0;
          if (local_c8->opt->no_line_numbers == false) {
            local_9c = in->data[uVar6]->m_line;
          }
          XmlWriter::writeAttribute<unsigned_int>(pXVar1,(string *)&local_50,&local_9c);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"skipped","");
          XmlWriter::writeAttribute(pXVar1,&local_70,in->data[uVar6]->m_skip);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._0_8_ != &local_40) {
            operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
          }
          if ((XmlWriter *)local_98._0_8_ != (XmlWriter *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          XmlWriter::ScopedElement::~ScopedElement(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < in->num_data);
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"OverallResultsTestCases","");
      pXVar1 = &local_c8->xml;
      local_c0._0_8_ = pXVar1;
      XmlWriter::startElement(pXVar1,&local_108);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"unskipped","");
      XmlWriter::writeAttribute<unsigned_int>
                (pXVar1,&local_e8,&in->run_stats->numTestCasesPassingFilters);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0010e2c6:
  XmlWriter::endElement(&local_c8->xml);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            test_run_start();
            if(opt.list_reporters) {
                for(auto& curr : getListeners())
                    xml.scopedElement("Listener")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
                for(auto& curr : getReporters())
                    xml.scopedElement("Reporter")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
            } else if(opt.count || opt.list_test_cases) {
                for(unsigned i = 0; i < in.num_data; ++i) {
                    xml.scopedElement("TestCase").writeAttribute("name", in.data[i]->m_name)
                        .writeAttribute("testsuite", in.data[i]->m_test_suite)
                        .writeAttribute("filename", skipPathFromFilename(in.data[i]->m_file.c_str()))
                        .writeAttribute("line", line(in.data[i]->m_line))
                        .writeAttribute("skipped", in.data[i]->m_skip);
                }
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
            } else if(opt.list_test_suites) {
                for(unsigned i = 0; i < in.num_data; ++i)
                    xml.scopedElement("TestSuite").writeAttribute("name", in.data[i]->m_test_suite);
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
                xml.scopedElement("OverallResultsTestSuites")
                        .writeAttribute("unskipped", in.run_stats->numTestSuitesPassingFilters);
            }
            xml.endElement();
        }